

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O3

type __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>::
reset<std::__cxx11::istringstream&>
          (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source)

{
  char cVar1;
  stream_source<char> local_1b0;
  basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>> local_18;
  
  stream_source<char>::stream_source
            (&local_1b0,(basic_istream<char,_std::char_traits<char>_> *)source,0x4000);
  local_18 = (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>)0x1;
  stream_source<char>::operator=((stream_source<char> *)(this + 8),&local_1b0);
  this[0x1a0] = local_18;
  stream_source<char>::~stream_source(&local_1b0);
  basic_csv_parser<char,_std::allocator<char>_>::reinitialize
            ((basic_csv_parser<char,_std::allocator<char>_> *)(this + 0x1a8));
  local_1b0.null_is_.super_basic_istream<char,_std::char_traits<char>_>._22_8_ = 0;
  local_1b0.null_is_.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream._6_2_ =
       0;
  local_1b0.null_is_.super_basic_istream<char,_std::char_traits<char>_>._M_gcount._0_4_ = 0;
  local_1b0.null_is_.super_basic_istream<char,_std::char_traits<char>_>._M_gcount._4_2_ = 0;
  local_1b0.null_is_.super_basic_istream<char,_std::char_traits<char>_>._M_gcount._6_2_ = 0;
  local_1b0.null_is_.super_basic_istream<char,_std::char_traits<char>_>._16_6_ = 0;
  *(undefined2 *)(this + 0x3b0) = 3;
  *(undefined4 *)(this + 0x3b2) =
       local_1b0.null_is_.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream.
       _0_4_;
  *(uint *)(this + 0x3b6) =
       (uint)local_1b0.null_is_.super_basic_istream<char,_std::char_traits<char>_>.
             _vptr_basic_istream._4_2_;
  *(undefined4 *)(this + 0x3ba) = 0;
  *(undefined4 *)(this + 0x3be) = 0;
  *(undefined8 *)(this + 0x3c0) = 0;
  *(undefined8 *)(this + 0x3c8) = 0;
  *(undefined4 *)(this + 0x3d0) = 0;
  *(undefined4 *)(this + 0x3d8) = 0;
  *(undefined8 *)(this + 0x3e0) = 0;
  *(undefined8 *)(this + 1000) = 0;
  *(undefined8 *)(this + 0x3f0) = 0;
  *(undefined8 *)(this + 0x3f8) = 0;
  *(undefined8 *)(this + 0x400) = 0;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x38))(this);
  }
  return;
}

Assistant:

typename std::enable_if<!std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type
    reset(Sourceable&& source)
    {
        source_ = std::forward<Sourceable>(source);
        parser_.reinitialize();
        cursor_visitor_.reset();
        if (!done())
        {
            next();
        }
    }